

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::MILSpec::TensorValue::ByteSizeLong(TensorValue *this)

{
  size_t sVar1;
  
  switch(this->_oneof_case_[0]) {
  case 1:
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::MILSpec::TensorValue_RepeatedFloats>
                      ((this->value_).floats_);
    break;
  case 2:
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::MILSpec::TensorValue_RepeatedInts>
                      ((this->value_).ints_);
    break;
  case 3:
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::MILSpec::TensorValue_RepeatedBools>
                      ((this->value_).bools_);
    break;
  case 4:
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::MILSpec::TensorValue_RepeatedStrings>
                      ((this->value_).strings_);
    break;
  case 5:
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts>
                      ((this->value_).longints_);
    break;
  case 6:
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::MILSpec::TensorValue_RepeatedDoubles>
                      ((this->value_).doubles_);
    break;
  case 7:
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::MILSpec::TensorValue_RepeatedBytes>
                      ((this->value_).bytes_);
    break;
  default:
    sVar1 = 0;
    goto LAB_0025a5e6;
  }
  sVar1 = sVar1 + 1;
LAB_0025a5e6:
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t TensorValue::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.TensorValue)
  size_t total_size = 0;

  switch (value_case()) {
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedFloats floats = 1;
    case kFloats: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.floats_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedInts ints = 2;
    case kInts: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.ints_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedBools bools = 3;
    case kBools: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.bools_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedStrings strings = 4;
    case kStrings: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.strings_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedLongInts longInts = 5;
    case kLongInts: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.longints_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedDoubles doubles = 6;
    case kDoubles: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.doubles_);
      break;
    }
    // .CoreML.Specification.MILSpec.TensorValue.RepeatedBytes bytes = 7;
    case kBytes: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *value_.bytes_);
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}